

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

ValueHolder *
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (ThreadLocalValueHolderBase *base)

{
  long lVar1;
  GTestLog local_c;
  
  if (base != (ThreadLocalValueHolderBase *)0x0) {
    lVar1 = __dynamic_cast(base,&ThreadLocalValueHolderBase::typeinfo,
                           &ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder::
                            typeinfo,0);
    if (lVar1 == 0) {
      GTestLog::GTestLog(&local_c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/build_O2/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                         ,0x486);
      std::operator<<((ostream *)&std::cerr,
                      "Condition base == nullptr || dynamic_cast<Derived*>(base) != nullptr failed. "
                     );
      GTestLog::~GTestLog(&local_c);
    }
  }
  return (ValueHolder *)base;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
  static_assert(std::is_base_of<Base, Derived>::value,
                "target type not derived from source type");
#if GTEST_HAS_RTTI
  GTEST_CHECK_(base == nullptr || dynamic_cast<Derived*>(base) != nullptr);
#endif
  return static_cast<Derived*>(base);
}